

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O1

void printshape(char *out_file)

{
  pointer ppVar1;
  int iVar2;
  double dVar3;
  FILE *__stream;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  pointer ppVar7;
  ulong uVar8;
  paaword now;
  vector<int,_std::allocator<int>_> local_a8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  __stream = fopen(out_file,"w");
  if (0 < num_c) {
    lVar6 = 0;
    do {
      fprintf(__stream,"%d\n",(ulong)(uint)shapelets_n[lVar6]);
      ppVar7 = results[lVar6].super__Vector_base<paaword,_std::allocator<paaword>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (results[lVar6].super__Vector_base<paaword,_std::allocator<paaword>_>._M_impl.
          super__Vector_impl_data._M_finish != ppVar7) {
        uVar5 = 0;
        do {
          ppVar1 = ppVar7 + uVar5;
          iVar2 = ppVar1->window;
          dVar3 = ppVar1->score;
          std::vector<int,_std::allocator<int>_>::vector(&local_a8,&ppVar1->vec);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _Rb_tree(&local_90,&ppVar7[uVar5].cov._M_t);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _Rb_tree(&local_60,&ppVar7[uVar5].allcov._M_t);
          fprintf(__stream,"%f,%d",-dVar3,
                  ((long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) * (long)iVar2);
          if (((long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * (long)iVar2 != 0) {
            uVar8 = 0;
            do {
              uVar4 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
              fprintf(__stream,",%f",
                      ((double)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[(int)((long)uVar4 / (long)iVar2)] +
                      0.5) * bucket_w + min_data,(long)uVar4 % (long)iVar2 & 0xffffffff);
              uVar8 = uVar8 + 1;
              uVar4 = ((long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) * (long)iVar2;
            } while (uVar8 <= uVar4 && uVar4 - uVar8 != 0);
          }
          fputc(10,__stream);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_60);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_90);
          if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar5 = uVar5 + 1;
          ppVar7 = results[lVar6].super__Vector_base<paaword,_std::allocator<paaword>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = ((long)results[lVar6].super__Vector_base<paaword,_std::allocator<paaword>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppVar7 >> 3) *
                  -0xf0f0f0f0f0f0f0f;
        } while (uVar5 <= uVar8 && uVar8 - uVar5 != 0);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < num_c);
  }
  fclose(__stream);
  return;
}

Assistant:

void printshape(char *out_file) {
    FILE *f;
    f = fopen(out_file, "w");

    for (int i = 0; i < num_c; ++i) {
        fprintf(f, "%d\n", shapelets_n[i]);
//        for (paaword now : results[i]) {
        for (int j = 0; j < results[i].size(); ++j) {
            paaword now = results[i][j];
            fprintf(f, "%f,%d", -now.score, now.window * now.vec.size());
            for (int k = 0; k < now.window * now.vec.size(); ++k) {
                fprintf(f, ",%f", paa2ts(now.vec[k / now.window]));
            }
            fprintf(f, "\n");
//            fprintf(f, "vector\t\t");
//            for (int k = 0; k < now.vec.size(); ++k) {
//                fprintf(f, " %d", now.vec[k]);
//            }
//            fprintf(f, "\ncover\t\t");
//            for (set<int>::iterator cov = now.cov.begin(); cov != now.cov.end(); ++cov) {
//                fprintf(f, " %d", *cov);
//            }
//            fprintf(f, "\nall cover\t");
//            for (set<int>::iterator cov = now.allcov.begin(); cov != now.allcov.end(); ++cov) {
//                fprintf(f, " %d", *cov);
//            }
//            fprintf(f, "\n");
        }
    }

    fclose(f);
}